

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

vector<int,_std::allocator<int>_> *
getAscendingNumbers(vector<int,_std::allocator<int>_> *__return_storage_ptr__,int inputSize)

{
  iterator __position;
  int local_1c;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c = 0;
  if (0 < inputSize) {
    do {
      __position._M_current =
           (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)__return_storage_ptr__,__position,&local_1c);
      }
      else {
        *__position._M_current = local_1c;
        (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      local_1c = local_1c + 1;
    } while (local_1c < inputSize);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<int> getAscendingNumbers(int inputSize) {
    vector<int> ascendingNumbers;

    for (int i = 0; i < inputSize; i++) {
        ascendingNumbers.push_back(i);
    }
    return ascendingNumbers;
}